

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution1D_x86_fma::create_pipeline(Convolution1D_x86_fma *this,Option *param_2)

{
  long *in_RDI;
  int num_input;
  int in_stack_00000574;
  int in_stack_00000578;
  int in_stack_0000057c;
  Mat *in_stack_00000580;
  Mat *in_stack_00000588;
  
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x140) == 0) {
    convolution1d_transform_kernel_packed
              (in_stack_00000588,in_stack_00000580,in_stack_0000057c,in_stack_00000578,
               in_stack_00000574);
  }
  return 0;
}

Assistant:

int Convolution1D_x86_fma::create_pipeline(const Option& /*opt*/)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    convolution1d_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w);

    return 0;
}